

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_common.hpp
# Opt level: O2

void __thiscall
oqpi::global_sync_object<oqpi::posix_event<oqpi::event_auto_reset_policy_impl>_>::
global_sync_object<>
          (global_sync_object<oqpi::posix_event<oqpi::event_auto_reset_policy_impl>_> *this,
          string *name,sync_object_creation_options creationOption)

{
  posix_event<oqpi::event_auto_reset_policy_impl>::posix_event
            (&this->super_posix_event<oqpi::event_auto_reset_policy_impl>,name,creationOption);
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  return;
}

Assistant:

global_sync_object(const std::string &name, sync_object_creation_options creationOption, _Args &&...args)
            : _Impl(name, creationOption, std::forward<_Args>(args)...)
            , name_(name)
        {}